

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::XFBGlobalBufferTest::getBufferDescriptors
          (XFBGlobalBufferTest *this,GLuint test_case_index,Vector *out_descriptors)

{
  pointer this_00;
  pointer pbVar1;
  undefined4 uVar2;
  uchar uVar3;
  GLuint i;
  pointer this_01;
  ulong uVar4;
  ulong __new_size;
  Type *this_02;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_150;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_138;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_120;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  this_02 = &(this->m_test_cases).
             super__Vector_base<gl4cts::EnhancedLayouts::XFBGlobalBufferTest::_testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBGlobalBufferTest::_testCase>_>
             ._M_impl.super__Vector_impl_data._M_start[test_case_index].m_type;
  std::
  vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
  ::resize(out_descriptors,3);
  pbVar1 = (out_descriptors->
           super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1->m_index = 0;
  pbVar1->m_target = Uniform;
  pbVar1[1].m_index = 1;
  pbVar1[1].m_target = Transform_feedback;
  pbVar1[2].m_index = 3;
  uVar2 = Utils::s_rand;
  pbVar1[2].m_target = Transform_feedback;
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138,this_02);
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c0,this_02);
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8,this_02);
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f0,this_02);
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108,this_02);
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120,this_02);
  Utils::s_rand = uVar2;
  Utils::Type::GenerateDataPacked
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_150,this_02);
  Utils::Type::GenerateDataPacked
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,this_02);
  Utils::Type::GenerateDataPacked
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,this_02);
  Utils::Type::GenerateDataPacked
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,this_02);
  Utils::Type::GenerateDataPacked
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90,this_02);
  Utils::Type::GenerateDataPacked
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,this_02);
  uVar7 = (long)local_138._M_impl.super__Vector_impl_data._M_finish -
          (long)local_138._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)local_150._M_impl.super__Vector_impl_data._M_finish -
          (long)local_150._M_impl.super__Vector_impl_data._M_start;
  iVar5 = (int)uVar7;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&pbVar1->m_initial_data,(ulong)(uint)(iVar5 * 6));
  uVar7 = uVar7 & 0xffffffff;
  memcpy((pbVar1->m_initial_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start,local_138._M_impl.super__Vector_impl_data._M_start
         ,uVar7);
  memcpy((void *)(*(long *)&(pbVar1->m_initial_data).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data + uVar7),
         local_c0._M_impl.super__Vector_impl_data._M_start,uVar7);
  memcpy((void *)((ulong)(uint)(iVar5 * 2) +
                 *(long *)&(pbVar1->m_initial_data).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data),
         local_d8._M_impl.super__Vector_impl_data._M_start,uVar7);
  memcpy((void *)((ulong)(uint)(iVar5 * 3) +
                 *(long *)&(pbVar1->m_initial_data).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data),
         local_f0._M_impl.super__Vector_impl_data._M_start,uVar7);
  memcpy((void *)((ulong)(uint)(iVar5 << 2) +
                 *(long *)&(pbVar1->m_initial_data).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data),
         local_108._M_impl.super__Vector_impl_data._M_start,uVar7);
  memcpy((void *)((ulong)(uint)(iVar5 * 5) +
                 *(long *)&(pbVar1->m_initial_data).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data),
         local_120._M_impl.super__Vector_impl_data._M_start,uVar7);
  iVar5 = (int)uVar4;
  __new_size = (ulong)(uint)(iVar5 * 3);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&pbVar1[1].m_initial_data,__new_size);
  this_00 = pbVar1 + 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this_00->m_expected_data,__new_size);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&pbVar1[2].m_initial_data,__new_size);
  this_01 = pbVar1 + 2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this_01->m_expected_data,__new_size);
  for (uVar7 = 0; __new_size != uVar7; uVar7 = uVar7 + 1) {
    uVar3 = (uchar)uVar7;
    pbVar1[1].m_initial_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar7] = uVar3;
    (this_00->m_expected_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar7] = uVar3;
    pbVar1[2].m_initial_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar7] = uVar3;
    (this_01->m_expected_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar7] = uVar3;
  }
  uVar6 = iVar5 * 2;
  uVar4 = uVar4 & 0xffffffff;
  memcpy((this_01->m_expected_data).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + uVar6,local_150._M_impl.super__Vector_impl_data._M_start
         ,uVar4);
  memcpy((this_00->m_expected_data).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,local_48._M_impl.super__Vector_impl_data._M_start,uVar4);
  memcpy((this_00->m_expected_data).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + uVar4,local_60._M_impl.super__Vector_impl_data._M_start,
         uVar4);
  memcpy((this_00->m_expected_data).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + uVar6,local_78._M_impl.super__Vector_impl_data._M_start,
         uVar4);
  memcpy((this_01->m_expected_data).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,local_90._M_impl.super__Vector_impl_data._M_start,uVar4);
  memcpy((this_01->m_expected_data).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + uVar4,local_a8._M_impl.super__Vector_impl_data._M_start,
         uVar4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_90);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_78);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_150);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_120);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_108);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_f0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_d8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_138);
  return;
}

Assistant:

void XFBGlobalBufferTest::getBufferDescriptors(glw::GLuint test_case_index, bufferDescriptor::Vector& out_descriptors)
{
	// the function "getType(test_case_index)" can't return correct data type, so change code as following:
	const Utils::Type& type = m_test_cases[test_case_index].m_type;

	/* Test needs single uniform and two xfbs */
	out_descriptors.resize(3);

	/* Get references */
	bufferDescriptor& uniform = out_descriptors[0];
	bufferDescriptor& xfb_1   = out_descriptors[1];
	bufferDescriptor& xfb_3   = out_descriptors[2];

	/* Index */
	uniform.m_index = 0;
	xfb_1.m_index   = 1;
	xfb_3.m_index   = 3;

	/* Target */
	uniform.m_target = Utils::Buffer::Uniform;
	xfb_1.m_target   = Utils::Buffer::Transform_feedback;
	xfb_3.m_target   = Utils::Buffer::Transform_feedback;

	/* Data */
	const GLuint				gen_start   = Utils::s_rand;
	const std::vector<GLubyte>& chichi_data = type.GenerateData();
	const std::vector<GLubyte>& bulma_data  = type.GenerateData();
	const std::vector<GLubyte>& trunks_data = type.GenerateData();
	const std::vector<GLubyte>& bra_data	= type.GenerateData();
	const std::vector<GLubyte>& gohan_data  = type.GenerateData();
	const std::vector<GLubyte>& goten_data  = type.GenerateData();

	Utils::s_rand								= gen_start;
	const std::vector<GLubyte>& chichi_data_pck = type.GenerateDataPacked();
	const std::vector<GLubyte>& bulma_data_pck  = type.GenerateDataPacked();
	const std::vector<GLubyte>& trunks_data_pck = type.GenerateDataPacked();
	const std::vector<GLubyte>& bra_data_pck	= type.GenerateDataPacked();
	const std::vector<GLubyte>& gohan_data_pck  = type.GenerateDataPacked();
	const std::vector<GLubyte>& goten_data_pck  = type.GenerateDataPacked();

	const GLuint type_size	 = static_cast<GLuint>(chichi_data.size());
	const GLuint type_size_pck = static_cast<GLuint>(chichi_data_pck.size());

	/* Uniform data */
	uniform.m_initial_data.resize(6 * type_size);
	memcpy(&uniform.m_initial_data[0] + 0, &chichi_data[0], type_size);
	memcpy(&uniform.m_initial_data[0] + type_size, &bulma_data[0], type_size);
	memcpy(&uniform.m_initial_data[0] + 2 * type_size, &trunks_data[0], type_size);
	memcpy(&uniform.m_initial_data[0] + 3 * type_size, &bra_data[0], type_size);
	memcpy(&uniform.m_initial_data[0] + 4 * type_size, &gohan_data[0], type_size);
	memcpy(&uniform.m_initial_data[0] + 5 * type_size, &goten_data[0], type_size);

	/* XFB data */
	xfb_1.m_initial_data.resize(3 * type_size_pck);
	xfb_1.m_expected_data.resize(3 * type_size_pck);
	xfb_3.m_initial_data.resize(3 * type_size_pck);
	xfb_3.m_expected_data.resize(3 * type_size_pck);

	for (GLuint i = 0; i < 3 * type_size_pck; ++i)
	{
		xfb_1.m_initial_data[i]  = (glw::GLubyte)i;
		xfb_1.m_expected_data[i] = (glw::GLubyte)i;
		xfb_3.m_initial_data[i]  = (glw::GLubyte)i;
		xfb_3.m_expected_data[i] = (glw::GLubyte)i;
	}

	memcpy(&xfb_3.m_expected_data[0] + 2 * type_size_pck, &chichi_data_pck[0], type_size_pck);
	memcpy(&xfb_1.m_expected_data[0] + 0 * type_size_pck, &bulma_data_pck[0], type_size_pck);
	memcpy(&xfb_1.m_expected_data[0] + 1 * type_size_pck, &trunks_data_pck[0], type_size_pck);
	memcpy(&xfb_1.m_expected_data[0] + 2 * type_size_pck, &bra_data_pck[0], type_size_pck);
	memcpy(&xfb_3.m_expected_data[0] + 0 * type_size_pck, &gohan_data_pck[0], type_size_pck);
	memcpy(&xfb_3.m_expected_data[0] + 1 * type_size_pck, &goten_data_pck[0], type_size_pck);
}